

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O2

bool __thiscall GF2::WW<127UL>::IsAll(WW<127UL> *this,bool val)

{
  word wVar1;
  undefined3 in_register_00000031;
  
  wVar1 = 0x7fffffffffffffff;
  if (CONCAT31(in_register_00000031,val) == 0) {
    wVar1 = 0;
  }
  return wVar1 == this->_words[1] && -(ulong)CONCAT31(in_register_00000031,val) == this->_words[0];
}

Assistant:

bool IsAll(bool val) const
	{
		// проверить все слова представления, кроме последнего
		word w = val ? WORD_MAX : 0;
		size_t pos = 0;
        for (; pos + 1 < _wcount; pos++)
			if (_words[pos] != w) 
				return false;
		// проверить последнее слово представления
		return _words[pos] == (w << _tcount >> _tcount);
	}